

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O0

string * Uri::Uri::referenceResolution(string *__return_storage_ptr__,string *scheme,string *path)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  allocator<char> local_21;
  string *local_20;
  string *path_local;
  string *scheme_local;
  
  local_20 = path;
  path_local = scheme;
  scheme_local = __return_storage_ptr__;
  bVar1 = std::operator==(scheme,"https");
  if (((bVar1) || (bVar1 = std::operator==(path_local,"http"), bVar1)) ||
     (bVar1 = std::operator==(path_local,"file"), bVar1)) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"/",&local_21);
      std::allocator<char>::~allocator(&local_21);
      return __return_storage_ptr__;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    if (*pcVar3 != '/') {
      std::operator+(__return_storage_ptr__,"/",local_20);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
  return __return_storage_ptr__;
}

Assistant:

string Uri::referenceResolution (const string &scheme, const string &path) {
    if (scheme == "https" || scheme == "http" || scheme == "file") {
        if (path.empty()) {
            return "/";
        }

        if (path[0] != '/') {
            return "/" + path;
        }
    }

    return path;
}